

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_quad_value_bit_vector.h
# Opt level: O2

string * __thiscall
bsim::static_quad_value_bit_vector<41>::binary_string_abi_cxx11_
          (string *__return_storage_ptr__,static_quad_value_bit_vector<41> *this)

{
  uint uVar1;
  quad_value local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_48);
  for (uVar1 = 0x28; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    local_49.value = this->bits[uVar1].value;
    quad_value::binary_string_abi_cxx11_(&local_48,&local_49);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string binary_string() const {
      std::string str = "";
      for (int i = N - 1; i >= 0; i--) {
        str += get(i).binary_string();
      }

      return str;
    }